

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

size_t skip_line_splice(Source_File *src)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = src->where_in_src;
  uVar3 = src->src_size - 1;
  if (uVar3 <= uVar1) {
    return 0;
  }
  sVar2 = 0;
  while( true ) {
    if (src->src[sVar2 + uVar1] != '\\') {
      return sVar2;
    }
    if (src->src[sVar2 + uVar1 + 1] != '\n') break;
    uVar4 = uVar1 + sVar2 + 2;
    src->where_in_src = uVar4;
    sVar2 = sVar2 + 2;
    if (uVar3 <= uVar4) {
      return sVar2;
    }
  }
  return sVar2;
}

Assistant:

size_t skip_line_splice(struct Source_File *src)
{
	size_t current_size=0;
	while(src->where_in_src<src->src_size-1 && src->src[src->where_in_src]=='\\' && src->src[src->where_in_src+1]=='\n')
	{
		src->where_in_src+=2;
		current_size+=2;
	}
	return current_size;
}